

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O3

iterator __thiscall
absl::lts_20250127::container_internal::
raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_float>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_float>_>_>
::find_non_soo<int>(raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_float>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_float>_>_>
                    *this,key_arg<int> *key,size_t hash)

{
  ctrl_t *pcVar1;
  ulong uVar2;
  uint uVar3;
  ctrl_t cVar4;
  ctrl_t cVar5;
  ctrl_t cVar6;
  ctrl_t cVar7;
  ctrl_t cVar8;
  ctrl_t cVar9;
  ctrl_t cVar10;
  ctrl_t cVar11;
  ctrl_t cVar12;
  ctrl_t cVar13;
  ctrl_t cVar14;
  ctrl_t cVar15;
  ctrl_t cVar16;
  ctrl_t cVar17;
  ctrl_t cVar18;
  ctrl_t cVar19;
  ushort uVar20;
  ctrl_t *pcVar21;
  slot_type *psVar22;
  ulong extraout_RDX;
  ulong uVar23;
  ulong uVar24;
  uint uVar25;
  ulong uVar26;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  __m128i match;
  undefined1 auVar33 [16];
  iterator iVar34;
  ctrl_t cVar27;
  ctrl_t cVar30;
  ctrl_t cVar31;
  ctrl_t cVar32;
  
  uVar2 = (this->settings_).
          super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_float>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
          .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
          capacity_;
  if (uVar2 == 1) {
    __assert_fail("(!is_soo()) && \"Try enabling sanitizers.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xe2a,
                  "iterator absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<int, float>, absl::hash_internal::Hash<int>, std::equal_to<int>, std::allocator<std::pair<const int, float>>>::find_non_soo(const key_arg<K> &, size_t) [Policy = absl::container_internal::FlatHashMapPolicy<int, float>, Hash = absl::hash_internal::Hash<int>, Eq = std::equal_to<int>, Alloc = std::allocator<std::pair<const int, float>>, K = int]"
                 );
  }
  if (uVar2 != 0) {
    if ((uVar2 + 1 & uVar2) != 0) {
      __assert_fail("(((mask + 1) & mask) == 0 && \"not a mask\") && \"Try enabling sanitizers.\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                    ,0x14c,
                    "absl::container_internal::probe_seq<16>::probe_seq(size_t, size_t) [Width = 16]"
                   );
    }
    uVar23 = hash >> 7 ^
             (ulong)(this->settings_).
                    super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_float>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                    .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                    .value.heap_or_soo_.heap.control >> 0xc;
    pcVar21 = control(this);
    auVar28 = ZEXT216(CONCAT11((char)hash,(char)hash) & 0x7f7f);
    auVar28 = pshuflw(auVar28,auVar28,0);
    uVar26 = 0;
    while( true ) {
      uVar23 = uVar23 & uVar2;
      pcVar1 = pcVar21 + uVar23;
      cVar4 = *pcVar1;
      cVar5 = pcVar1[1];
      cVar6 = pcVar1[2];
      cVar7 = pcVar1[3];
      cVar8 = pcVar1[4];
      cVar9 = pcVar1[5];
      cVar10 = pcVar1[6];
      cVar11 = pcVar1[7];
      cVar12 = pcVar1[8];
      cVar13 = pcVar1[9];
      cVar14 = pcVar1[10];
      cVar15 = pcVar1[0xb];
      cVar16 = pcVar1[0xc];
      cVar17 = pcVar1[0xd];
      cVar18 = pcVar1[0xe];
      cVar19 = pcVar1[0xf];
      cVar27 = auVar28[0];
      auVar29[0] = -(cVar27 == cVar4);
      cVar30 = auVar28[1];
      auVar29[1] = -(cVar30 == cVar5);
      cVar31 = auVar28[2];
      auVar29[2] = -(cVar31 == cVar6);
      cVar32 = auVar28[3];
      auVar29[3] = -(cVar32 == cVar7);
      auVar29[4] = -(cVar27 == cVar8);
      auVar29[5] = -(cVar30 == cVar9);
      auVar29[6] = -(cVar31 == cVar10);
      auVar29[7] = -(cVar32 == cVar11);
      auVar29[8] = -(cVar27 == cVar12);
      auVar29[9] = -(cVar30 == cVar13);
      auVar29[10] = -(cVar31 == cVar14);
      auVar29[0xb] = -(cVar32 == cVar15);
      auVar29[0xc] = -(cVar27 == cVar16);
      auVar29[0xd] = -(cVar30 == cVar17);
      auVar29[0xe] = -(cVar31 == cVar18);
      auVar29[0xf] = -(cVar32 == cVar19);
      uVar20 = (ushort)(SUB161(auVar29 >> 7,0) & 1) | (ushort)(SUB161(auVar29 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar29 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar29 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar29 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar29 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar29 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar29 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar29 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar29 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar29 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar29 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar29 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar29 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar29 >> 0x77,0) & 1) << 0xe | (ushort)(auVar29[0xf] >> 7) << 0xf;
      uVar25 = (uint)uVar20;
      while (uVar20 != 0) {
        uVar3 = 0;
        if (uVar25 != 0) {
          for (; (uVar25 >> uVar3 & 1) == 0; uVar3 = uVar3 + 1) {
          }
        }
        psVar22 = slot_array(this);
        uVar24 = uVar3 + uVar23 & uVar2;
        if (psVar22[uVar24].value.first == *key) {
          iVar34 = iterator_at(this,uVar24);
          return iVar34;
        }
        uVar20 = (ushort)(uVar25 - 1) & (ushort)uVar25;
        uVar25 = CONCAT22((short)(uVar25 - 1 >> 0x10),uVar20);
      }
      auVar33[0] = -(cVar4 == kEmpty);
      auVar33[1] = -(cVar5 == kEmpty);
      auVar33[2] = -(cVar6 == kEmpty);
      auVar33[3] = -(cVar7 == kEmpty);
      auVar33[4] = -(cVar8 == kEmpty);
      auVar33[5] = -(cVar9 == kEmpty);
      auVar33[6] = -(cVar10 == kEmpty);
      auVar33[7] = -(cVar11 == kEmpty);
      auVar33[8] = -(cVar12 == kEmpty);
      auVar33[9] = -(cVar13 == kEmpty);
      auVar33[10] = -(cVar14 == kEmpty);
      auVar33[0xb] = -(cVar15 == kEmpty);
      auVar33[0xc] = -(cVar16 == kEmpty);
      auVar33[0xd] = -(cVar17 == kEmpty);
      auVar33[0xe] = -(cVar18 == kEmpty);
      auVar33[0xf] = -(cVar19 == kEmpty);
      if ((((((((((((((((auVar33 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                       (auVar33 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar33 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar33 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar33 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar33 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar33 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar33 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar33 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar33 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar33 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar33 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar33 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (auVar33 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar33 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) || cVar19 == kEmpty) {
        AssertNotDebugCapacity(this);
        auVar28._8_8_ = 0;
        auVar28._0_8_ = extraout_RDX;
        return (iterator)(auVar28 << 0x40);
      }
      uVar24 = (this->settings_).
               super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_float>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
               .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.
               value.capacity_;
      if (uVar24 == 0) break;
      uVar23 = uVar23 + uVar26 + 0x10;
      uVar26 = uVar26 + 0x10;
      if (uVar24 < uVar26) {
        __assert_fail("(seq.index() <= capacity() && \"full table!\") && \"Try enabling sanitizers.\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                      ,0xe37,
                      "iterator absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<int, float>, absl::hash_internal::Hash<int>, std::equal_to<int>, std::allocator<std::pair<const int, float>>>::find_non_soo(const key_arg<K> &, size_t) [Policy = absl::container_internal::FlatHashMapPolicy<int, float>, Hash = absl::hash_internal::Hash<int>, Eq = std::equal_to<int>, Alloc = std::allocator<std::pair<const int, float>>, K = int]"
                     );
      }
    }
  }
  __assert_fail("cap >= kDefaultCapacity",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                ,0xb75,
                "size_t absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<int, float>, absl::hash_internal::Hash<int>, std::equal_to<int>, std::allocator<std::pair<const int, float>>>::capacity() const [Policy = absl::container_internal::FlatHashMapPolicy<int, float>, Hash = absl::hash_internal::Hash<int>, Eq = std::equal_to<int>, Alloc = std::allocator<std::pair<const int, float>>]"
               );
}

Assistant:

size_t capacity() const { return capacity_; }